

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

int xmlTextReaderNodeType(xmlTextReaderPtr reader)

{
  xmlNode *node;
  xmlElementType xVar1;
  int iVar2;
  xmlNode *pxVar3;
  
  xVar1 = 0xffffffff;
  if (reader != (xmlTextReaderPtr)0x0) {
    node = reader->node;
    xVar1 = 0;
    if (node != (xmlNode *)0x0) {
      pxVar3 = reader->curnode;
      if (reader->curnode == (xmlNode *)0x0) {
        pxVar3 = node;
      }
      xVar1 = pxVar3->type;
      switch(xVar1) {
      case XML_ELEMENT_NODE:
        xVar1 = XML_ELEMENT_NODE;
        if ((reader->state + ~XML_TEXTREADER_ELEMENT & 0xfffffffdU) == 0) {
          xVar1 = XML_ELEMENT_DECL;
        }
        break;
      case XML_ATTRIBUTE_NODE:
      case XML_NAMESPACE_DECL:
        xVar1 = XML_ATTRIBUTE_NODE;
        break;
      case XML_TEXT_NODE:
        iVar2 = xmlIsBlankNode(node);
        if (iVar2 == 0) {
          xVar1 = XML_TEXT_NODE;
        }
        else {
          iVar2 = xmlNodeGetSpacePreserve(reader->node);
          xVar1 = XML_DTD_NODE - (iVar2 == 0);
        }
        break;
      case XML_CDATA_SECTION_NODE:
      case XML_ENTITY_REF_NODE:
      case XML_ENTITY_NODE:
      case XML_PI_NODE:
      case XML_COMMENT_NODE:
      case XML_DOCUMENT_FRAG_NODE:
      case XML_NOTATION_NODE:
        break;
      case XML_DOCUMENT_NODE:
      case XML_HTML_DOCUMENT_NODE:
      case XML_DOCB_DOCUMENT_NODE:
        xVar1 = XML_DOCUMENT_NODE;
        break;
      case XML_DOCUMENT_TYPE_NODE:
      case XML_DTD_NODE:
        xVar1 = XML_DOCUMENT_TYPE_NODE;
        break;
      case XML_ELEMENT_DECL:
      case XML_ATTRIBUTE_DECL:
      case XML_ENTITY_DECL:
      case XML_XINCLUDE_START:
      case XML_XINCLUDE_END:
        xVar1 = 0;
        break;
      default:
        xVar1 = 0xffffffff;
      }
    }
  }
  return xVar1;
}

Assistant:

int
xmlTextReaderNodeType(xmlTextReaderPtr reader) {
    xmlNodePtr node;

    if (reader == NULL)
	return(-1);
    if (reader->node == NULL)
	return(XML_READER_TYPE_NONE);
    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;
    switch (node->type) {
        case XML_ELEMENT_NODE:
	    if ((reader->state == XML_TEXTREADER_END) ||
		(reader->state == XML_TEXTREADER_BACKTRACK))
		return(XML_READER_TYPE_END_ELEMENT);
	    return(XML_READER_TYPE_ELEMENT);
        case XML_NAMESPACE_DECL:
        case XML_ATTRIBUTE_NODE:
	    return(XML_READER_TYPE_ATTRIBUTE);
        case XML_TEXT_NODE:
	    if (xmlIsBlankNode(reader->node)) {
		if (xmlNodeGetSpacePreserve(reader->node))
		    return(XML_READER_TYPE_SIGNIFICANT_WHITESPACE);
		else
		    return(XML_READER_TYPE_WHITESPACE);
	    } else {
		return(XML_READER_TYPE_TEXT);
	    }
        case XML_CDATA_SECTION_NODE:
	    return(XML_READER_TYPE_CDATA);
        case XML_ENTITY_REF_NODE:
	    return(XML_READER_TYPE_ENTITY_REFERENCE);
        case XML_ENTITY_NODE:
	    return(XML_READER_TYPE_ENTITY);
        case XML_PI_NODE:
	    return(XML_READER_TYPE_PROCESSING_INSTRUCTION);
        case XML_COMMENT_NODE:
	    return(XML_READER_TYPE_COMMENT);
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
#ifdef LIBXML_DOCB_ENABLED
        case XML_DOCB_DOCUMENT_NODE:
#endif
	    return(XML_READER_TYPE_DOCUMENT);
        case XML_DOCUMENT_FRAG_NODE:
	    return(XML_READER_TYPE_DOCUMENT_FRAGMENT);
        case XML_NOTATION_NODE:
	    return(XML_READER_TYPE_NOTATION);
        case XML_DOCUMENT_TYPE_NODE:
        case XML_DTD_NODE:
	    return(XML_READER_TYPE_DOCUMENT_TYPE);

        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
	    return(XML_READER_TYPE_NONE);
    }
    return(-1);
}